

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

logic_t __thiscall slang::SVInt::operator<(SVInt *this,SVInt *rhs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bitwidth_t bVar6;
  bitwidth_t bVar7;
  byte bVar8;
  int i;
  uint uVar9;
  logic_t lVar10;
  SVInt local_30;
  
  lVar10.value = 0x80;
  if (((this->super_SVIntStorage).unknownFlag == false) &&
     ((rhs->super_SVIntStorage).unknownFlag == false)) {
    uVar9 = (this->super_SVIntStorage).bitWidth;
    uVar1 = (rhs->super_SVIntStorage).bitWidth;
    if (uVar9 == uVar1) {
      bVar8 = 0;
      if (((rhs->super_SVIntStorage).signFlag & (this->super_SVIntStorage).signFlag) != 0) {
        bVar4 = isNegative(this);
        bVar5 = isNegative(rhs);
        if (bVar4 != bVar5) {
          bVar4 = isNegative(this);
          return (logic_t)bVar4;
        }
        uVar9 = (this->super_SVIntStorage).bitWidth;
        bVar8 = (this->super_SVIntStorage).unknownFlag;
      }
      if ((uVar9 < 0x41) && ((bVar8 & 1) == 0)) {
        lVar10.value = (this->super_SVIntStorage).field_0.val <
                       (rhs->super_SVIntStorage).field_0.val;
      }
      else {
        bVar6 = getActiveBits(this);
        bVar7 = getActiveBits(rhs);
        lVar10.value = '\x01';
        if (bVar7 <= bVar6) {
          if (bVar6 - 1 < bVar7) {
            uVar9 = bVar6 - 1 >> 6;
            do {
              if ((int)uVar9 < 0) goto LAB_00178f69;
              uVar2 = (this->super_SVIntStorage).field_0.pVal[uVar9];
              uVar3 = (rhs->super_SVIntStorage).field_0.pVal[uVar9];
              if (uVar3 < uVar2) goto LAB_00178f69;
              uVar9 = uVar9 - 1;
            } while (uVar3 <= uVar2);
          }
          else {
LAB_00178f69:
            lVar10.value = '\0';
          }
        }
      }
    }
    else {
      if (uVar9 < uVar1) {
        extend(&local_30,(bitwidth_t)this,SUB41(uVar1,0));
        lVar10 = operator<(&local_30,rhs);
      }
      else {
        extend(&local_30,(bitwidth_t)rhs,SUB41(uVar9,0));
        lVar10 = operator<(this,&local_30);
      }
      ~SVInt(&local_30);
    }
  }
  return (logic_t)lVar10.value;
}

Assistant:

logic_t SVInt::operator<(const SVInt& rhs) const {
    if (unknownFlag || rhs.hasUnknown())
        return logic_t::x;

    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) < rhs;
        else
            return *this < rhs.extend(bitWidth, bothSigned);
    }
    // handle signed negatives
    if (bothSigned && isNegative() ^ rhs.isNegative())
        return logic_t(isNegative());

    // both are positive or both are negative
    // or not both are signed
    if (isSingleWord())
        return logic_t(val < rhs.val);

    bitwidth_t a1 = getActiveBits();
    bitwidth_t a2 = rhs.getActiveBits();
    if (a1 < a2)
        return logic_t(true);
    if (a2 < a1)
        return logic_t(false);
    if (a1 == 0)
        return logic_t(false); // both values are zero

    // same number of words, compare each one until there's no match
    uint32_t top = whichWord(a1 - 1);
    for (int i = int(top); i >= 0; i--) {
        if (pVal[i] > rhs.pVal[i])
            return logic_t(false);
        if (pVal[i] < rhs.pVal[i])
            return logic_t(true);
    }
    return logic_t(false);
}